

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_strnicmp(char *zLeft,char *zRight,int N)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  
  if (zLeft == (char *)0x0) {
    return -(uint)(zRight != (char *)0x0);
  }
  if (zRight == (char *)0x0) {
    return 1;
  }
  if (N < 1) {
    bVar2 = true;
  }
  else {
    pbVar1 = (byte *)(zLeft + (uint)N);
    pbVar3 = (byte *)(zRight + (uint)N);
    do {
      if (((ulong)(byte)*zLeft == 0) || (""[(byte)*zLeft] != ""[(byte)*zRight])) goto LAB_0013511e;
      zLeft = (char *)((byte *)zLeft + 1);
      zRight = (char *)((byte *)zRight + 1);
      bVar2 = 1 < N;
      N = N + -1;
    } while (bVar2);
    N = 0;
    zRight = (char *)pbVar3;
    zLeft = (char *)pbVar1;
LAB_0013511e:
    bVar2 = N < 1;
  }
  if (!bVar2) {
    return (uint)""[(byte)*zLeft] - (uint)""[(byte)*zRight];
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_strnicmp(const char *zLeft, const char *zRight, int N){
  register unsigned char *a, *b;
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( N-- > 0 && *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return N<0 ? 0 : UpperToLower[*a] - UpperToLower[*b];
}